

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a4ae0::CBBTest_StickyError_Test::TestBody(CBBTest_StickyError_Test *this)

{
  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *this_00;
  bool bVar1;
  int iVar2;
  cbb_st *pcVar3;
  char *pcVar4;
  char *in_R9;
  string local_490;
  AssertHelper local_470;
  Message local_468;
  bool local_459;
  undefined1 local_458 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_428;
  Message local_420;
  bool local_411;
  undefined1 local_410 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_3e0;
  Message local_3d8;
  bool local_3c9;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_398;
  Message local_390;
  int local_384;
  undefined1 local_380 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_350;
  Message local_348;
  bool local_339;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_308;
  Message local_300;
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_2c0;
  Message local_2b8;
  bool local_2a9;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_278;
  Message local_270;
  int local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__6;
  undefined1 local_248 [7];
  uint8_t buf;
  AssertHelper local_228;
  Message local_220;
  bool local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__4;
  size_t len;
  uint8_t *ptr;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_140;
  Message local_138;
  int local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_f8;
  Message local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__1;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0 [3];
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  CBB child;
  ScopedCBB cbb;
  CBBTest_StickyError_Test *this_local;
  
  this_00 = (StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&child.u + 0x18);
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated(this_00);
  pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get(this_00);
  local_84 = CBB_init(pcVar3,0);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_80,&local_84,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_80,(AssertionResult *)"CBB_init(cbb.get(), 0)","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x4c0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a8,local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(local_a0);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&child.u + 0x18));
    local_e4 = CBB_add_u8_length_prefixed(pcVar3,(CBB *)&gtest_ar_.message_);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_e0,&local_e4,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_e0,
                 (AssertionResult *)"CBB_add_u8_length_prefixed(cbb.get(), &child)","false","true",
                 in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c1,pcVar4);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_f0);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_12c = CBB_add_bytes((CBB *)&gtest_ar_.message_,"",0x100);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_128,&local_12c,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar1) {
        testing::Message::Message(&local_138);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_128,
                   (AssertionResult *)"CBB_add_bytes(&child, kZeros, sizeof(kZeros))","false","true"
                   ,in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x4c2,pcVar4);
        testing::internal::AssertHelper::operator=(&local_140,&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_138);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                            ((long)&child.u + 0x18));
        iVar2 = CBB_flush(pcVar3);
        local_171 = iVar2 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_170,&local_171,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
        if (!bVar1) {
          testing::Message::Message(&local_180);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&ptr,(internal *)local_170,(AssertionResult *)"CBB_flush(cbb.get())",
                     "true","false",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_188,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x4c3,pcVar4);
          testing::internal::AssertHelper::operator=(&local_188,&local_180);
          testing::internal::AssertHelper::~AssertHelper(&local_188);
          std::__cxx11::string::~string((string *)&ptr);
          testing::Message::~Message(&local_180);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              ((long)&child.u + 0x18));
          iVar2 = CBB_add_u8(pcVar3,'\0');
          local_1c9 = iVar2 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
          if (!bVar1) {
            testing::Message::Message(&local_1d8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_1c8,
                       (AssertionResult *)"CBB_add_u8(cbb.get(), 0)","true","false",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1e0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x4c8,pcVar4);
            testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
            testing::internal::AssertHelper::~AssertHelper(&local_1e0);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_1d8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
          pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              ((long)&child.u + 0x18));
          iVar2 = CBB_finish(pcVar3,(uint8_t **)&len,(size_t *)&gtest_ar__4.message_);
          local_211 = iVar2 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_210,&local_211,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
          if (!bVar1) {
            testing::Message::Message(&local_220);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_248,(internal *)local_210,
                       (AssertionResult *)"CBB_finish(cbb.get(), &ptr, &len)","true","false",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_228,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x4c9,pcVar4);
            testing::internal::AssertHelper::operator=(&local_228,&local_220);
            testing::internal::AssertHelper::~AssertHelper(&local_228);
            std::__cxx11::string::~string((string *)local_248);
            testing::Message::~Message(&local_220);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
          bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::Reset
                    ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                     ((long)&child.u + 0x18));
          pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              ((long)&child.u + 0x18));
          local_264 = CBB_init_fixed(pcVar3,(uint8_t *)
                                            ((long)&gtest_ar__6.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            + 7),1);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_260,&local_264,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
          if (!bVar1) {
            testing::Message::Message(&local_270);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__7.message_,(internal *)local_260,
                       (AssertionResult *)"CBB_init_fixed(cbb.get(), &buf, 1)","false","true",in_R9)
            ;
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_278,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x4ce,pcVar4);
            testing::internal::AssertHelper::operator=(&local_278,&local_270);
            testing::internal::AssertHelper::~AssertHelper(&local_278);
            std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
            testing::Message::~Message(&local_270);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                ((long)&child.u + 0x18));
            iVar2 = CBB_add_bytes(pcVar3,"",0x100);
            local_2a9 = iVar2 == 0;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_2a8,&local_2a9,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
            if (!bVar1) {
              testing::Message::Message(&local_2b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__8.message_,(internal *)local_2a8,
                         (AssertionResult *)"CBB_add_bytes(cbb.get(), kZeros, sizeof(kZeros))",
                         "true","false",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_2c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x4cf,pcVar4);
              testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
              testing::internal::AssertHelper::~AssertHelper(&local_2c0);
              std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
              testing::Message::~Message(&local_2b8);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  ((long)&child.u + 0x18));
              iVar2 = CBB_add_u8(pcVar3,'\0');
              local_2f1 = iVar2 == 0;
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
              if (!bVar1) {
                testing::Message::Message(&local_300);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__9.message_,(internal *)local_2f0,
                           (AssertionResult *)"CBB_add_u8(cbb.get(), 0)","true","false",in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_308,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                           ,0x4d2,pcVar4);
                testing::internal::AssertHelper::operator=(&local_308,&local_300);
                testing::internal::AssertHelper::~AssertHelper(&local_308);
                std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                testing::Message::~Message(&local_300);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
              pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  ((long)&child.u + 0x18));
              iVar2 = CBB_finish(pcVar3,(uint8_t **)&len,(size_t *)&gtest_ar__4.message_);
              local_339 = iVar2 == 0;
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_338,&local_339,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
              if (!bVar1) {
                testing::Message::Message(&local_348);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__10.message_,(internal *)local_338,
                           (AssertionResult *)"CBB_finish(cbb.get(), &ptr, &len)","true","false",
                           in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_350,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                           ,0x4d3,pcVar4);
                testing::internal::AssertHelper::operator=(&local_350,&local_348);
                testing::internal::AssertHelper::~AssertHelper(&local_350);
                std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                testing::Message::~Message(&local_348);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
              bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::Reset
                        ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                         ((long)&child.u + 0x18));
              pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  ((long)&child.u + 0x18));
              local_384 = CBB_init(pcVar3,0);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_380,&local_384,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
              if (!bVar1) {
                testing::Message::Message(&local_390);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__11.message_,(internal *)local_380,
                           (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_398,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                           ,0x4d7,pcVar4);
                testing::internal::AssertHelper::operator=(&local_398,&local_390);
                testing::internal::AssertHelper::~AssertHelper(&local_398);
                std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                testing::Message::~Message(&local_390);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                   ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                    ((long)&child.u + 0x18));
                iVar2 = CBB_add_u24(pcVar3,0x1000000);
                local_3c9 = iVar2 == 0;
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_3c8,&local_3c9,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_3c8);
                if (!bVar1) {
                  testing::Message::Message(&local_3d8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__12.message_,(internal *)local_3c8,
                             (AssertionResult *)"CBB_add_u24(cbb.get(), 1u << 24)","true","false",
                             in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_3e0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                             ,0x4d8,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
                  testing::internal::AssertHelper::~AssertHelper(&local_3e0);
                  std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                  testing::Message::~Message(&local_3d8);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::
                           get((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                               ((long)&child.u + 0x18));
                  iVar2 = CBB_add_u8(pcVar3,'\0');
                  local_411 = iVar2 == 0;
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_410,&local_411,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_410);
                  if (!bVar1) {
                    testing::Message::Message(&local_420);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__13.message_,(internal *)local_410,
                               (AssertionResult *)"CBB_add_u8(cbb.get(), 0)","true","false",in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_428,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                               ,0x4db,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_428,&local_420);
                    testing::internal::AssertHelper::~AssertHelper(&local_428);
                    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                    testing::Message::~Message(&local_420);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
                  pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::
                           get((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                               ((long)&child.u + 0x18));
                  iVar2 = CBB_finish(pcVar3,(uint8_t **)&len,(size_t *)&gtest_ar__4.message_);
                  local_459 = iVar2 == 0;
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_458,&local_459,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_458);
                  if (!bVar1) {
                    testing::Message::Message(&local_468);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_490,(internal *)local_458,
                               (AssertionResult *)"CBB_finish(cbb.get(), &ptr, &len)","true","false"
                               ,in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_470,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                               ,0x4dc,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_470,&local_468);
                    testing::internal::AssertHelper::~AssertHelper(&local_470);
                    std::__cxx11::string::~string((string *)&local_490);
                    testing::Message::~Message(&local_468);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&child.u + 0x18));
  return;
}

Assistant:

TEST(CBBTest, StickyError) {
  // Write an input that exceeds the limit for its length prefix.
  bssl::ScopedCBB cbb;
  CBB child;
  static const uint8_t kZeros[256] = {0};
  ASSERT_TRUE(CBB_init(cbb.get(), 0));
  ASSERT_TRUE(CBB_add_u8_length_prefixed(cbb.get(), &child));
  ASSERT_TRUE(CBB_add_bytes(&child, kZeros, sizeof(kZeros)));
  ASSERT_FALSE(CBB_flush(cbb.get()));

  // All future operations should fail.
  uint8_t *ptr;
  size_t len;
  EXPECT_FALSE(CBB_add_u8(cbb.get(), 0));
  EXPECT_FALSE(CBB_finish(cbb.get(), &ptr, &len));

  // Write an input that cannot fit in a fixed CBB.
  cbb.Reset();
  uint8_t buf;
  ASSERT_TRUE(CBB_init_fixed(cbb.get(), &buf, 1));
  ASSERT_FALSE(CBB_add_bytes(cbb.get(), kZeros, sizeof(kZeros)));

  // All future operations should fail.
  EXPECT_FALSE(CBB_add_u8(cbb.get(), 0));
  EXPECT_FALSE(CBB_finish(cbb.get(), &ptr, &len));

  // Write a u32 that cannot fit in a u24.
  cbb.Reset();
  ASSERT_TRUE(CBB_init(cbb.get(), 0));
  ASSERT_FALSE(CBB_add_u24(cbb.get(), 1u << 24));

  // All future operations should fail.
  EXPECT_FALSE(CBB_add_u8(cbb.get(), 0));
  EXPECT_FALSE(CBB_finish(cbb.get(), &ptr, &len));
}